

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O3

size_t sei_render(sei_t *sei,uint8_t *data)

{
  uint8_t *__s;
  size_t sVar1;
  uint8_t *__s_00;
  sei_msgtype_t sVar2;
  uint uVar3;
  sei_message_t *psVar4;
  uint uVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  uint8_t *puVar9;
  
  if ((sei == (sei_t *)0x0) || (sei->head == (sei_message_t *)0x0)) {
LAB_00106cc6:
    sVar6 = 0;
  }
  else {
    *data = '\x06';
    __s_00 = data + 1;
    sVar6 = 2;
    for (psVar4 = sei->head; psVar4 != (sei_message_t *)0x0; psVar4 = psVar4->next) {
      sVar2 = psVar4->type;
      uVar5 = (uint)psVar4->size;
      if (0xfe < (int)sVar2) {
        iVar7 = sVar2 - 0x1fd;
        if (sVar2 < 0x1fd) {
          iVar7 = 0;
        }
        uVar8 = (ulong)(iVar7 + 0xfeU) / 0xff;
        memset(__s_00,0xff,uVar8 + 1);
        sVar6 = sVar6 + uVar8 + 1;
        __s_00 = __s_00 + uVar8 + 1;
        sVar2 = (sVar2 + (iVar7 + 0xfeU) / 0xff) - 0xff;
      }
      *__s_00 = (uint8_t)sVar2;
      __s = __s_00 + 1;
      puVar9 = __s_00;
      if (0xfe < (int)uVar5) {
        iVar7 = uVar5 - 0x1fd;
        if (uVar5 < 0x1fd) {
          iVar7 = 0;
        }
        uVar3 = iVar7 + 0xfe;
        uVar8 = (ulong)uVar3 / 0xff;
        memset(__s,0xff,uVar8 + 1);
        sVar6 = sVar6 + uVar8 + 1;
        puVar9 = __s + uVar8;
        uVar5 = (uVar5 + uVar3 / 0xff + (uVar3 / 0xff) * -0x100) - 0xff;
        __s = __s_00 + uVar8 + 2;
      }
      *__s = (uint8_t)uVar5;
      sVar1 = _copy_from_rbsp(puVar9 + 2,(uint8_t *)(psVar4 + 1),(long)(int)uVar5);
      if (sVar1 == 0) goto LAB_00106cc6;
      sVar6 = sVar6 + sVar1 + 2;
      __s_00 = puVar9 + 2 + sVar1;
    }
    *__s_00 = 0x80;
  }
  return sVar6;
}

Assistant:

size_t sei_render(sei_t* sei, uint8_t* data)
{
    if (!sei || !sei->head) {
        return 0;
    }

    size_t escaped_size, size = 2; // nalu_type + stop bit
    sei_message_t* msg;
    (*data) = 6;
    ++data;

    for (msg = sei_message_head(sei); msg; msg = sei_message_next(msg)) {
        int payloadType = sei_message_type(msg);
        int payloadSize = (int)sei_message_size(msg);
        uint8_t* payloadData = sei_message_data(msg);

        while (255 <= payloadType) {
            (*data) = 255;
            ++data;
            ++size;
            payloadType -= 255;
        }

        (*data) = payloadType;
        ++data;
        ++size;

        while (255 <= payloadSize) {
            (*data) = 255;
            ++data;
            ++size;
            payloadSize -= 255;
        }

        (*data) = payloadSize;
        ++data;
        ++size;

        if (0 >= (escaped_size = _copy_from_rbsp(data, payloadData, payloadSize))) {
            return 0;
        }

        data += escaped_size;
        size += escaped_size;
    }

    // write stop bit and return
    (*data) = 0x80;
    return size;
}